

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O3

void * DBG_get_module_id(void)

{
  int iVar1;
  undefined1 local_30 [8];
  Dl_info dl_info;
  
  if (DBG_get_module_id::s_module_id != (void *)0x0) {
    return DBG_get_module_id::s_module_id;
  }
  iVar1 = dladdr(DBG_get_module_id,local_30);
  DBG_get_module_id::s_module_id =
       (void *)(-(ulong)(dl_info.dli_fbase == (void *)0x0) | (ulong)dl_info.dli_fname |
               -(ulong)(iVar1 == 0));
  return DBG_get_module_id::s_module_id;
}

Assistant:

static const void *DBG_get_module_id()
{
    static const void *s_module_id = NULL;
    if (s_module_id == NULL)
    {
        Dl_info dl_info;
        if (dladdr((void *) DBG_get_module_id, &dl_info) == 0 || dl_info.dli_sname == NULL)
        {
            s_module_id = (void *) -1;
        }
        else
        {
            s_module_id = dl_info.dli_fbase;
        }
    }
    return s_module_id;
}